

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fonts.cpp
# Opt level: O1

ImFont * fonts::font_combined(float size_px)

{
  ImGuiIO *pIVar1;
  ImFont *pIVar2;
  ImFontConfig config;
  ImFontConfig local_98;
  
  ImFontConfig::ImFontConfig(&local_98);
  pIVar1 = ImGui::GetIO();
  ImFontAtlas::AddFontFromMemoryCompressedTTF
            (pIVar1->Fonts,&cousine_regular_compressed_data,0x92fe,size_px,&local_98,
             font_combined::cousine_ranges);
  local_98.MergeMode = true;
  local_98.PixelSnapH = true;
  pIVar2 = ImFontAtlas::AddFontFromMemoryCompressedTTF
                     (pIVar1->Fonts,fontawesome_regular_compressed_data,0x571f,size_px,&local_98,
                      font_combined::fontawesome_ranges);
  return pIVar2;
}

Assistant:

ImFont * font_combined( float size_px )
{
    static const ImWchar cousine_ranges[]     = { 0x0020, 0x00FF, 0x0100, 0x017F, 0 };
    static const ImWchar fontawesome_ranges[] = { 0xf000, 0xf976, 0 };

    ImFontConfig config;

    ImGuiIO & io = ImGui::GetIO();
    io.Fonts->AddFontFromMemoryCompressedTTF(
        cousine_regular_compressed_data, cousine_regular_compressed_size, size_px, &config, cousine_ranges );
    config.MergeMode  = true;
    config.PixelSnapH = true;
    return io.Fonts->AddFontFromMemoryCompressedTTF(
        fontawesome_regular_compressed_data, fontawesome_regular_compressed_size, size_px, &config,
        fontawesome_ranges );
}